

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall mkvparser::Cluster::GetFirst(Cluster *this,BlockEntry **pFirst)

{
  bool bVar1;
  long lVar2;
  long len;
  longlong pos;
  long local_20;
  longlong local_18;
  
  if (0 < this->m_entries_count) goto LAB_0015b7d1;
  lVar2 = Parse(this,&local_18,&local_20);
  if (lVar2 < 0) {
LAB_0015b7c4:
    *pFirst = (BlockEntry *)0x0;
    bVar1 = false;
  }
  else {
    if (this->m_entries_count < 1) {
      lVar2 = 0;
      goto LAB_0015b7c4;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return lVar2;
  }
LAB_0015b7d1:
  *pFirst = *this->m_entries;
  return 0;
}

Assistant:

long Cluster::GetFirst(const BlockEntry*& pFirst) const {
  if (m_entries_count <= 0) {
    long long pos;
    long len;

    const long status = Parse(pos, len);

    if (status < 0) {  // error
      pFirst = NULL;
      return status;
    }

    if (m_entries_count <= 0) {  // empty cluster
      pFirst = NULL;
      return 0;
    }
  }

  assert(m_entries);

  pFirst = m_entries[0];
  assert(pFirst);

  return 0;  // success
}